

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool ContextualCheckBlock
               (CBlock *block,BlockValidationState *state,ChainstateManager *chainman,
               CBlockIndex *pindexPrev)

{
  iterator __first1;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  int64_t iVar5;
  long in_RCX;
  allocator<char> *in_RSI;
  char (*in_RDI) [21];
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  int64_t nLockTimeCutoff;
  bool enforce_locktime_median_time_past;
  int nHeight;
  const_iterator __end1;
  const_iterator __begin1;
  CScript expect;
  undefined6 in_stack_fffffffffffffda8;
  BuriedDeployment in_stack_fffffffffffffdae;
  ChainstateManager *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  undefined8 in_stack_fffffffffffffdc0;
  BlockValidationResult BVar6;
  const_iterator in_stack_fffffffffffffdc8;
  ValidationState<BlockValidationResult> *this;
  iterator in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  CTransaction *in_stack_fffffffffffffde0;
  allocator<char> *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 expect_witness_commitment;
  CBlock *in_stack_fffffffffffffe58;
  byte local_11e;
  undefined1 local_11d [2];
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  shared_ptr<const_CTransaction> *local_118;
  shared_ptr<const_CTransaction> *local_110;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  bVar1 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                    ((CBlockIndex *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                     in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
  if (bVar1) {
    if (in_RCX == 0) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x107a,
                    "bool ContextualCheckBlock(const CBlock &, BlockValidationState &, const ChainstateManager &, const CBlockIndex *)"
                   );
    }
    bVar2 = true;
  }
  if (bVar2) {
    CBlockIndex::GetMedianTimePast((CBlockIndex *)in_stack_fffffffffffffdc8.ptr);
  }
  else {
    CBlockHeader::GetBlockTime
              ((CBlockHeader *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
  }
  local_110 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)in_stack_fffffffffffffdb0);
  local_118 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffffdb0);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdbf,
                                   CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                       (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_fffffffffffffdb0);
    expect_witness_commitment = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
    BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              CONCAT17(in_stack_fffffffffffffdbf,
                       CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    bVar2 = IsFinalTx(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                      (int64_t)in_stack_fffffffffffffdd0.ptr);
    BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_11e = ValidationState<BlockValidationResult>::Invalid
                            ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffdc8.ptr
                             ,BVar6,(string *)
                                    CONCAT17(in_stack_fffffffffffffdbf,
                                             CONCAT16(in_stack_fffffffffffffdbe,
                                                      in_stack_fffffffffffffdb8)),
                             (string *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator(&local_11a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator(&local_119);
      goto LAB_007e4dc1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
  }
  bVar2 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                    ((CBlockIndex *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                     in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
  if (bVar2) {
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    CScript::CScript((CScript *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
    CScript::operator<<((CScript *)
                        CONCAT17(in_stack_fffffffffffffdbf,
                                 CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                        (int64_t)in_stack_fffffffffffffdb0);
    CScript::CScript((CScript *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8),
                     (CScript *)0x7e4904);
    CScript::~CScript((CScript *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT17(in_stack_fffffffffffffdbf,
                             CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 (size_type)in_stack_fffffffffffffdb0);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
               (size_type)in_stack_fffffffffffffdb0);
    sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    sVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    if (sVar3 < sVar4) {
LAB_007e4a45:
      in_stack_fffffffffffffdf0 = &local_11b;
      in_stack_fffffffffffffde8 = in_RSI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_11e = ValidationState<BlockValidationResult>::Invalid
                            ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffdc8.ptr
                             ,BVar6,(string *)
                                    CONCAT17(in_stack_fffffffffffffdbf,
                                             CONCAT16(in_stack_fffffffffffffdbe,
                                                      in_stack_fffffffffffffdb8)),
                             (string *)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffddc = CONCAT13(local_11e,(int3)in_stack_fffffffffffffddc);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator((allocator<char> *)(local_11d + 1));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator(&local_11b);
      bVar2 = true;
    }
    else {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffdb0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffdb0);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdbf,
                               CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                   (size_type)in_stack_fffffffffffffdb0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 (size_type)in_stack_fffffffffffffdb0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffdb0);
      __first1.ptr._4_4_ = in_stack_fffffffffffffddc;
      __first1.ptr._0_4_ = in_stack_fffffffffffffdd8;
      in_stack_fffffffffffffdff =
           std::
           equal<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                     (__first1,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (!(bool)in_stack_fffffffffffffdff) goto LAB_007e4a45;
      bVar2 = false;
    }
    CScript::~CScript((CScript *)CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
    if (bVar2) goto LAB_007e4dc1;
  }
  DeploymentActiveAfter<Consensus::BuriedDeployment>
            ((CBlockIndex *)
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffdae);
  bVar2 = CheckWitnessMalleation
                    (in_stack_fffffffffffffe58,(bool)expect_witness_commitment,
                     (BlockValidationState *)
                     CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  if (bVar2) {
    iVar5 = GetBlockWeight((CBlock *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    if (iVar5 < 0x3d0901) {
      local_11e = 1;
    }
    else {
      this = (ValidationState<BlockValidationResult> *)local_11d;
      std::allocator<char>::allocator();
      BVar6 = (BlockValidationResult)((ulong)in_RSI >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      tinyformat::format<char[21]>
                ((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),in_RDI);
      local_11e = ValidationState<BlockValidationResult>::Invalid
                            (this,BVar6,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffdbf,
                                      CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8))
                             ,(string *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8));
      std::allocator<char>::~allocator((allocator<char> *)local_11d);
    }
  }
  else {
    local_11e = 0;
  }
LAB_007e4dc1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_11e & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool ContextualCheckBlock(const CBlock& block, BlockValidationState& state, const ChainstateManager& chainman, const CBlockIndex* pindexPrev)
{
    const int nHeight = pindexPrev == nullptr ? 0 : pindexPrev->nHeight + 1;

    // Enforce BIP113 (Median Time Past).
    bool enforce_locktime_median_time_past{false};
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CSV)) {
        assert(pindexPrev != nullptr);
        enforce_locktime_median_time_past = true;
    }

    const int64_t nLockTimeCutoff{enforce_locktime_median_time_past ?
                                      pindexPrev->GetMedianTimePast() :
                                      block.GetBlockTime()};

    // Check that all transactions are finalized
    for (const auto& tx : block.vtx) {
        if (!IsFinalTx(*tx, nHeight, nLockTimeCutoff)) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal", "non-final transaction");
        }
    }

    // Enforce rule that the coinbase starts with serialized block height
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB))
    {
        CScript expect = CScript() << nHeight;
        if (block.vtx[0]->vin[0].scriptSig.size() < expect.size() ||
            !std::equal(expect.begin(), expect.end(), block.vtx[0]->vin[0].scriptSig.begin())) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-height", "block height mismatch in coinbase");
        }
    }

    // Validation for witness commitments.
    // * We compute the witness hash (which is the hash including witnesses) of all the block's transactions, except the
    //   coinbase (where 0x0000....0000 is used instead).
    // * The coinbase scriptWitness is a stack of a single 32-byte vector, containing a witness reserved value (unconstrained).
    // * We build a merkle tree with all those witness hashes as leaves (similar to the hashMerkleRoot in the block header).
    // * There must be at least one output whose scriptPubKey is a single 36-byte push, the first 4 bytes of which are
    //   {0xaa, 0x21, 0xa9, 0xed}, and the following 32 bytes are SHA256^2(witness root, witness reserved value). In case there are
    //   multiple, the last one is used.
    if (!CheckWitnessMalleation(block, DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT), state)) {
        return false;
    }

    // After the coinbase witness reserved value and commitment are verified,
    // we can check if the block weight passes (before we've checked the
    // coinbase witness, it would be possible for the weight to be too
    // large by filling up the coinbase witness, which doesn't change
    // the block hash, so we couldn't mark the block as permanently
    // failed).
    if (GetBlockWeight(block) > MAX_BLOCK_WEIGHT) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-weight", strprintf("%s : weight limit failed", __func__));
    }

    return true;
}